

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_source_open.c
# Opt level: O1

int zip_source_open(zip_source_t *src)

{
  int iVar1;
  ulong uVar2;
  zip_int64_t zVar3;
  int ze;
  
  iVar1 = -1;
  if (src->source_closed != false) {
    return -1;
  }
  if (src->write_state == ZIP_SOURCE_WRITE_REMOVED) {
    ze = 0x17;
LAB_00110d11:
    zip_error_set(&src->error,ze,0);
  }
  else {
    if (src->open_count == 0) {
      if ((src->src != (zip_source_t *)0x0) && (iVar1 = zip_source_open(src->src), iVar1 < 0)) {
        zip_error_set_from_source(&src->error,src->src);
        return -1;
      }
      zVar3 = _zip_source_call(src,(void *)0x0,0,ZIP_SOURCE_OPEN);
      if (zVar3 < 0) {
        if (src->src == (zip_source_t *)0x0) {
          return -1;
        }
        zip_source_close(src->src);
        return -1;
      }
    }
    else {
      uVar2 = zip_source_supports(src);
      if ((uVar2 & 0x40) == 0) {
        ze = 0x1d;
        goto LAB_00110d11;
      }
    }
    src->eof = false;
    src->had_read_error = false;
    _zip_error_clear(&src->error);
    src->bytes_read = 0;
    src->open_count = src->open_count + 1;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

ZIP_EXTERN int
zip_source_open(zip_source_t *src) {
    if (src->source_closed) {
        return -1;
    }
    if (src->write_state == ZIP_SOURCE_WRITE_REMOVED) {
        zip_error_set(&src->error, ZIP_ER_DELETED, 0);
        return -1;
    }

    if (ZIP_SOURCE_IS_OPEN_READING(src)) {
        if ((zip_source_supports(src) & ZIP_SOURCE_MAKE_COMMAND_BITMASK(ZIP_SOURCE_SEEK)) == 0) {
            zip_error_set(&src->error, ZIP_ER_INUSE, 0);
            return -1;
        }
    }
    else {
        if (ZIP_SOURCE_IS_LAYERED(src)) {
            if (zip_source_open(src->src) < 0) {
                zip_error_set_from_source(&src->error, src->src);
                return -1;
            }
        }

        if (_zip_source_call(src, NULL, 0, ZIP_SOURCE_OPEN) < 0) {
            if (ZIP_SOURCE_IS_LAYERED(src)) {
                zip_source_close(src->src);
            }
            return -1;
        }
    }

    src->eof = false;
    src->had_read_error = false;
    _zip_error_clear(&src->error);
    src->bytes_read = 0;
    src->open_count++;

    return 0;
}